

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

Result __thiscall testing::Action<void_(int)>::Perform(Action<void_(int)> *this,ArgumentTuple *args)

{
  int local_14;
  
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/build_O1/googletest-src/googlemock/include/gmock/gmock-actions.h"
               ,0x31b);
  }
  if ((this->fun_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->fun_)._M_invoker)((_Any_data *)this,&local_14);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }